

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O3

void __thiscall duckdb::AddFieldInfo::AddFieldInfo(AddFieldInfo *this,ColumnDefinition *new_field_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  storage_t sVar5;
  CompressionType CVar6;
  undefined7 uVar7;
  
  *(undefined2 *)&(this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo.info_type = 0x100;
  (this->super_AlterTableInfo).super_AlterInfo.catalog._M_dataplus._M_p =
       (pointer)&(this->super_AlterTableInfo).super_AlterInfo.catalog.field_2;
  (this->super_AlterTableInfo).super_AlterInfo.catalog._M_string_length = 0;
  (this->super_AlterTableInfo).super_AlterInfo.catalog.field_2._M_local_buf[0] = '\0';
  (this->super_AlterTableInfo).super_AlterInfo.schema._M_dataplus._M_p =
       (pointer)&(this->super_AlterTableInfo).super_AlterInfo.schema.field_2;
  (this->super_AlterTableInfo).super_AlterInfo.schema._M_string_length = 0;
  (this->super_AlterTableInfo).super_AlterInfo.schema.field_2._M_local_buf[0] = '\0';
  (this->super_AlterTableInfo).super_AlterInfo.name._M_dataplus._M_p =
       (pointer)&(this->super_AlterTableInfo).super_AlterInfo.name.field_2;
  (this->super_AlterTableInfo).super_AlterInfo.name._M_string_length = 0;
  (this->super_AlterTableInfo).super_AlterInfo.name.field_2._M_local_buf[0] = '\0';
  (this->super_AlterTableInfo).super_AlterInfo.field_0x71 = 0xe;
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__AddFieldInfo_02450130;
  (this->column_path).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_path).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_path).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar2 = &(this->new_field).name.field_2;
  (this->new_field).name._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (new_field_p->name)._M_dataplus._M_p;
  paVar1 = &(new_field_p->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&(new_field_p->name).field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->new_field).name.field_2 + 8) = uVar4;
  }
  else {
    (this->new_field).name._M_dataplus._M_p = pcVar3;
    (this->new_field).name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->new_field).name._M_string_length = (new_field_p->name)._M_string_length;
  (new_field_p->name)._M_dataplus._M_p = (pointer)paVar1;
  (new_field_p->name)._M_string_length = 0;
  (new_field_p->name).field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&(this->new_field).type,&new_field_p->type);
  CVar6 = new_field_p->compression_type;
  uVar7 = *(undefined7 *)&new_field_p->field_0x39;
  sVar5 = new_field_p->storage_oid;
  uVar4 = *(undefined8 *)((long)&new_field_p->oid + 1);
  *(undefined8 *)((long)&(this->new_field).storage_oid + 1) =
       *(undefined8 *)((long)&new_field_p->storage_oid + 1);
  *(undefined8 *)((long)&(this->new_field).oid + 1) = uVar4;
  (this->new_field).compression_type = CVar6;
  *(undefined7 *)&(this->new_field).field_0x39 = uVar7;
  (this->new_field).storage_oid = sVar5;
  (this->new_field).expression.
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (new_field_p->expression).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (new_field_p->expression).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  Value::Value(&(this->new_field).comment,&new_field_p->comment);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&(this->new_field).tags,&new_field_p->tags,&new_field_p->tags);
  return;
}

Assistant:

AddFieldInfo::AddFieldInfo(ColumnDefinition new_field_p)
    : AlterTableInfo(AlterTableType::ADD_FIELD), new_field(std::move(new_field_p)) {
}